

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::GetStatus(CPU *this)

{
  ushort uVar1;
  uint uVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  CPU *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Cycles = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->cycles);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Program counter = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->pc);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Stack pointer = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->sp);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"memory.Read(pc) = ");
  auVar4 = std::ostream::operator<<(poVar3,std::hex);
  uVar2 = (*this->memory->_vptr_MemoryBus[2])
                    (this->memory,(ulong)this->pc,auVar4._8_8_,CONCAT62(auVar4._2_6_,this->pc));
  poVar3 = (ostream *)std::ostream::operator<<(auVar4._0_8_,uVar2 & 0xff);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"memory.Read(pc + 1) = ");
  auVar4 = std::ostream::operator<<(poVar3,std::hex);
  uVar1 = this->pc + 1;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])
                    (this->memory,(ulong)uVar1,auVar4._8_8_,CONCAT62(auVar4._2_6_,uVar1));
  poVar3 = (ostream *)std::ostream::operator<<(auVar4._0_8_,uVar2 & 0xff);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"A = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->A);
  poVar3 = std::operator<<(poVar3," X = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->X);
  poVar3 = std::operator<<(poVar3," Y = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->Y);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"C = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps & 1));
  poVar3 = std::operator<<(poVar3," Z = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 1 & 1));
  poVar3 = std::operator<<(poVar3," I = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 2 & 1));
  poVar3 = std::operator<<(poVar3," D = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 3 & 1));
  poVar3 = std::operator<<(poVar3," B = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 5 & 1));
  poVar3 = std::operator<<(poVar3," V = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 6 & 1));
  poVar3 = std::operator<<(poVar3," N = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)((this->field_6).ps >> 7));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CPU::GetStatus()
{
    // I'll leave this "as is" for now...
    std::cout << "Cycles = " << cycles << std::endl;
    std::cout << "Program counter = " << std::hex << (int)pc << std::endl;
    std::cout << "Stack pointer = " << std::hex << (int)sp << std::endl;
    std::cout << "memory.Read(pc) = " << std::hex << (int)memory.Read(pc) << std::endl;
    std::cout << "memory.Read(pc + 1) = " << std::hex << (int)memory.Read(pc + 1) << std::endl;
    std::cout << "A = " << std::hex << (int)A << " X = " << std::hex << (int)X << " Y = " << std::hex << (int)Y << std::endl;
    std::cout << "C = " << std::hex << (int)C << " Z = " << std::hex << (int)Z << " I = " << std::hex << (int)I << " D = " << std::hex << (int)D << " B = " << std::hex << (int)B << " V = " << std::hex << (int)V << " N = " << std::hex << (int)N << std::endl;
}